

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

int __thiscall font2svg::glyph::init(glyph *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  FT_Error FVar2;
  int iVar3;
  char *__nptr;
  long lVar4;
  ostream *poVar5;
  string local_450 [32];
  int local_430;
  int local_42c;
  int i_1;
  int i;
  char glyph_name [1024];
  FT_UInt glyph_index;
  string *unicode_s_local;
  glyph *this_local;
  
  this->face = (this->file).face;
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar4 = strtol(__nptr,(char **)0x0,0);
  this->codepoint = (int)lVar4;
  uVar1 = FT_Get_Char_Index(this->face,(long)this->codepoint);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"<!--\nUnicode requested: ");
  std::operator<<(poVar5,(string *)ctx);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8," (decimal: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->codepoint);
  poVar5 = std::operator<<(poVar5," hex: 0x");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->codepoint);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
  std::operator<<(poVar5,")");
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"\nGlyph index for unicode: ");
  std::ostream::operator<<(poVar5,uVar1);
  FVar2 = FT_Load_Glyph(this->face,uVar1,1);
  this->error = FVar2;
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,
                           "\nLoad Glyph into Face\'s glyph slot. error code: ");
  std::ostream::operator<<(poVar5,this->error);
  this->slot = this->face->glyph;
  memcpy(&this->ftoutline,&this->slot->outline,0x28);
  FT_Get_Glyph_Name(this->face,uVar1,&i_1,0x400);
  memcpy(&this->gm,&this->slot->metrics,0x40);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"\nGlyph Name: ");
  std::operator<<(poVar5,(char *)&i_1);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"\nGlyph Width: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->gm).width);
  poVar5 = std::operator<<(poVar5," Height: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->gm).height);
  poVar5 = std::operator<<(poVar5," Hor. Advance: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->gm).horiAdvance);
  poVar5 = std::operator<<(poVar5," Vert. Advance: ");
  std::ostream::operator<<(poVar5,(this->gm).vertAdvance);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"\nNum points: ");
  std::ostream::operator<<(poVar5,(this->ftoutline).n_points);
  poVar5 = std::operator<<((ostream *)&this->field_0xe8,"\nNum contours: ");
  std::ostream::operator<<(poVar5,(this->ftoutline).n_contours);
  std::operator<<((ostream *)&this->field_0xe8,"\nContour endpoint index values:");
  for (local_42c = 0; local_42c < (this->ftoutline).n_contours; local_42c = local_42c + 1) {
    poVar5 = std::operator<<((ostream *)&this->field_0xe8," ");
    std::ostream::operator<<(poVar5,(this->ftoutline).contours[local_42c]);
  }
  std::operator<<((ostream *)&this->field_0xe8,"\n-->\n");
  this->ftpoints = (this->ftoutline).points;
  for (local_430 = 0; local_430 < (this->ftoutline).n_points; local_430 = local_430 + 1) {
    this->ftpoints[local_430].y = -this->ftpoints[local_430].y;
  }
  this->bbheight = (int)(this->face->bbox).yMax - (int)(this->face->bbox).yMin;
  this->bbwidth = (int)(this->face->bbox).xMax - (int)(this->face->bbox).xMin;
  this->tags = (this->ftoutline).tags;
  this->contours = (this->ftoutline).contours;
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,local_450);
  iVar3 = std::__cxx11::string::~string(local_450);
  return iVar3;
}

Assistant:

void init( std::string unicode_s )
	{
		face = file.face;
		codepoint = strtol( unicode_s.c_str() , NULL, 0 );
		// Load the Glyph into the face's Glyph Slot + print details
		FT_UInt glyph_index = FT_Get_Char_Index( face, codepoint );
		debug << "<!--\nUnicode requested: " << unicode_s;
		debug << " (decimal: " << codepoint << " hex: 0x"
			<< std::hex << codepoint << std::dec << ")";
		debug << "\nGlyph index for unicode: " << glyph_index;
		error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
		debug << "\nLoad Glyph into Face's glyph slot. error code: " << error;
		slot = face->glyph;
		ftoutline = slot->outline;
		char glyph_name[1024];
		FT_Get_Glyph_Name( face, glyph_index, glyph_name, 1024 );
		gm = slot->metrics;
		debug << "\nGlyph Name: " << glyph_name;
		debug << "\nGlyph Width: " << gm.width
			<< " Height: " << gm.height
			<< " Hor. Advance: " << gm.horiAdvance
			<< " Vert. Advance: " << gm.vertAdvance;

		// Print outline details, taken from the glyph in the slot.
		debug << "\nNum points: " << ftoutline.n_points;
		debug << "\nNum contours: " << ftoutline.n_contours;
		debug << "\nContour endpoint index values:";
		for ( int i = 0 ; i < ftoutline.n_contours ; i++ ) debug << " " << ftoutline.contours[i];
		debug << "\n-->\n";

		// Invert y coordinates (SVG = neg at top, TType = neg at bottom)
		ftpoints = ftoutline.points;
		for ( int i = 0 ; i < ftoutline.n_points ; i++ )
			ftpoints[i].y *= -1;

		bbheight = face->bbox.yMax - face->bbox.yMin;
		bbwidth = face->bbox.xMax - face->bbox.xMin;
		tags = ftoutline.tags;
		contours = ftoutline.contours;
		std::cout << debug.str();
	}